

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

GLenum gl4cts::TextureViewUtilities::getTypeCompatibleWithInternalformat(GLenum internalformat)

{
  GLenum GVar1;
  TestError *this;
  uint uVar2;
  
  GVar1 = 0x1400;
  switch(internalformat) {
  case 0x822a:
  case 0x822c:
  case 0x8234:
  case 0x823a:
switchD_00aa4843_caseD_8d76:
    GVar1 = 0x1403;
    break;
  case 0x822d:
  case 0x822f:
    goto switchD_00aa482c_caseD_8231;
  case 0x822e:
  case 0x8230:
    goto switchD_00aa482c_caseD_8231;
  case 0x8231:
  case 0x8237:
    break;
  case 0x8233:
  case 0x8239:
    goto switchD_00aa482c_caseD_8231;
  case 0x8235:
  case 0x823b:
switchD_00aa482c_caseD_8231:
    return 0x1404;
  case 0x8236:
  case 0x823c:
    goto switchD_00aa482c_caseD_8231;
  default:
    switch(internalformat) {
    case 0x8d70:
    case 0x8d71:
      goto switchD_00aa482c_caseD_8231;
    case 0x8d72:
    case 0x8d73:
    case 0x8d74:
    case 0x8d75:
    case 0x8d78:
    case 0x8d79:
    case 0x8d7a:
    case 0x8d7b:
    case 0x8d7e:
    case 0x8d7f:
    case 0x8d80:
    case 0x8d81:
      goto switchD_00aa4880_caseD_8c3b;
    case 0x8d76:
    case 0x8d77:
      goto switchD_00aa4843_caseD_8d76;
    case 0x8d7c:
    case 0x8d7d:
      break;
    case 0x8d82:
    case 0x8d83:
      goto switchD_00aa482c_caseD_8231;
    default:
      uVar2 = internalformat - 0x8051;
      if (uVar2 < 0xb) {
        if ((0x1e1U >> (uVar2 & 0x1f) & 1) != 0) break;
        if ((0x408U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_00aa4843_caseD_8d76;
      }
      switch(internalformat) {
      case 0x8c3a:
switchD_00aa482c_caseD_8231:
        return 0x1406;
      case 0x8c3b:
      case 0x8c3c:
      case 0x8c3e:
      case 0x8c3f:
      case 0x8c40:
      case 0x8c42:
switchD_00aa4880_caseD_8c3b:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unrecognized internalformat",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x7f5);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0x8c3d:
      case 0x8c41:
      case 0x8c43:
        break;
      default:
        if (internalformat - 0x8f94 < 4) {
          return 0x1400;
        }
        if (internalformat - 0x8f98 < 4) {
switchD_00aa482c_caseD_8231:
          return 0x1402;
        }
        if (internalformat - 0x8814 < 2) {
          return 0x1406;
        }
        if (internalformat - 0x881a < 2) {
switchD_00aa482c_caseD_8231:
          return 0x140b;
        }
        if (internalformat - 0x8d88 < 2) {
          return 0x1402;
        }
        if (internalformat - 0x8d8e < 2) {
          return 0x1400;
        }
        if (internalformat == 0x81a5) goto switchD_00aa4843_caseD_8d76;
        if (internalformat == 0x81a6) {
switchD_00aa482c_caseD_8231:
          return 0x1405;
        }
        if (internalformat == 0x906f) {
          return 0x8368;
        }
        if (internalformat == 0x8cac) {
          return 0x1406;
        }
        if (internalformat == 0x8cad) {
          return 0x8dad;
        }
        if (internalformat != 0x8d62) {
          if (internalformat == 0x88f0) {
            return 0x84fa;
          }
          goto switchD_00aa4880_caseD_8c3b;
        }
      }
    }
  case 0x8229:
  case 0x822b:
  case 0x8232:
  case 0x8238:
    GVar1 = 0x1401;
  }
  return GVar1;
}

Assistant:

glw::GLenum TextureViewUtilities::getTypeCompatibleWithInternalformat(const glw::GLenum internalformat)
{
	glw::GLenum result = GL_NONE;

	/* Compressed internalformats not supported at the moment */

	switch (internalformat)
	{
	case GL_RGBA8_SNORM:
	case GL_RGB8_SNORM:
	case GL_RG8_SNORM:
	case GL_R8_SNORM:
	case GL_RGBA8I:
	case GL_RGB8I:
	case GL_RG8I:
	case GL_R8I:
	{
		result = GL_BYTE;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	{
		result = GL_UNSIGNED_INT_24_8;

		break;
	}

	case GL_DEPTH32F_STENCIL8:
	{
		result = GL_FLOAT_32_UNSIGNED_INT_24_8_REV;

		break;
	}

	case GL_RGBA16F:
	case GL_RGB16F:
	case GL_RG16F:
	case GL_R16F:
	{
		result = GL_HALF_FLOAT;

		break;
	}

	case GL_DEPTH_COMPONENT32F:
	case GL_RGBA32F:
	case GL_RGB32F:
	case GL_RG32F:
	case GL_R11F_G11F_B10F:
	case GL_R32F:
	{
		result = GL_FLOAT;

		break;
	}

	case GL_RGBA16_SNORM:
	case GL_RGB16_SNORM:
	case GL_RG16_SNORM:
	case GL_R16_SNORM:
	{
		result = GL_SHORT;

		break;
	}

	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGB5_A1:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB9_E5:
	case GL_RG8:
	case GL_R8:
	case GL_SRGB8_ALPHA8:
	case GL_SRGB8:
	case GL_RGBA8UI:
	case GL_RGB8UI:
	case GL_RG8UI:
	case GL_R8UI:
	{
		result = GL_UNSIGNED_BYTE;

		break;
	}

	case GL_R16I:
	case GL_RGBA16I:
	case GL_RGB16I:
	case GL_RG16I:
	{
		result = GL_SHORT;

		break;
	}

	case GL_DEPTH_COMPONENT16:
	case GL_RGBA16:
	case GL_RGB16:
	case GL_RG16:
	case GL_R16:
	case GL_RGBA16UI:
	case GL_RGB16UI:
	case GL_RG16UI:
	case GL_R16UI:
	{
		result = GL_UNSIGNED_SHORT;

		break;
	}

	case GL_RGBA32I:
	case GL_RGB32I:
	case GL_RG32I:
	case GL_R32I:
	{
		result = GL_INT;

		break;
	}

	case GL_DEPTH_COMPONENT24:
	case GL_RGBA32UI:
	case GL_RGB32UI:
	case GL_RG32UI:
	case GL_R32UI:
	{
		result = GL_UNSIGNED_INT;

		break;
	}

	case GL_RGB10_A2UI:
	{
		result = GL_UNSIGNED_INT_2_10_10_10_REV;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}